

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zero_copy_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::internal::TestZeroCopyInputStream::Skip
          (TestZeroCopyInputStream *this,int count)

{
  bool bVar1;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  string local_80 [36];
  int local_5c;
  reference pvStack_58;
  int front_size;
  value_type *front;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestZeroCopyInputStream *pTStack_18;
  int count_local;
  TestZeroCopyInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pTStack_18 = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(count);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"count >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream.h"
               ,0x4f,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [27])"count must not be negative");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->last_returned_buffer_,(nullptr_t)0x0);
  while( true ) {
    if (absl_log_internal_check_op_result._4_4_ == 0) {
      return true;
    }
    bVar1 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->buffers_);
    if (bVar1) break;
    pvStack_58 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->buffers_,0);
    local_5c = std::__cxx11::string::size();
    if (absl_log_internal_check_op_result._4_4_ < local_5c) {
      std::__cxx11::string::substr((ulong)local_80,(ulong)pvStack_58);
      std::__cxx11::string::operator=((string *)pvStack_58,local_80);
      std::__cxx11::string::~string(local_80);
      this->byte_count_ = (long)absl_log_internal_check_op_result._4_4_ + this->byte_count_;
      return true;
    }
    absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ - local_5c;
    this->byte_count_ = (long)local_5c + this->byte_count_;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->buffers_);
  }
  return false;
}

Assistant:

bool Skip(int count) override {
    ABSL_CHECK_GE(count, 0) << "count must not be negative";
    last_returned_buffer_ = nullptr;
    while (true) {
      if (count == 0) return true;
      if (buffers_.empty()) return false;
      auto& front = buffers_[0];
      int front_size = static_cast<int>(front.size());
      if (front_size <= count) {
        count -= front_size;
        byte_count_ += front_size;
        buffers_.pop_front();
      } else {
        // The front is enough, just chomp from it.
        front = front.substr(count);
        byte_count_ += count;
        return true;
      }
    }
  }